

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_movement_t * golf_entity_get_movement(golf_entity_t *entity)

{
  golf_entity_type_t gVar1;
  golf_entity_t *entity_local;
  
  gVar1 = entity->type;
  if (gVar1 == MODEL_ENTITY) {
    return (golf_movement_t *)((long)&entity->field_4 + 0x88);
  }
  if (1 < gVar1 - BALL_START_ENTITY) {
    if (gVar1 == GEO_ENTITY) {
      return (golf_movement_t *)((long)&entity->field_4 + 0x88);
    }
    if (3 < gVar1 - WATER_ENTITY) {
      return (golf_movement_t *)0x0;
    }
  }
  return (golf_movement_t *)0x0;
}

Assistant:

golf_movement_t *golf_entity_get_movement(golf_entity_t *entity) {
    switch (entity->type) {
        case MODEL_ENTITY: {
            return &entity->model.movement;
        }
        case GEO_ENTITY: {
            return &entity->geo.movement;
        }
        case BALL_START_ENTITY: 
        case WATER_ENTITY: 
        case HOLE_ENTITY: 
        case BEGIN_ANIMATION_ENTITY:
        case CAMERA_ZONE_ENTITY:
        case GROUP_ENTITY: {
            return NULL;
        }
    }
    return NULL;
}